

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LinearSegmentParameter *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  ushort uVar4;
  KStringStream ss;
  KString local_3a0;
  KString local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LinearSegmentParameter:\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tSegment Number:  ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tModification:\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\tLocation:      ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\tOrientation:   ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  LinearObjectAppearance::GetAsString_abi_cxx11_(&local_380,&this->m_ObjApr);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_3a0._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_3a0,1);
  if (local_380._M_string_length != 0) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      local_3a0._M_dataplus._M_p._0_1_ = local_380._M_dataplus._M_p[uVar3];
      if ((local_380._M_string_length - 1 == uVar3) || ((char)local_3a0._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_3a0,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_3a0,1);
        local_3a0._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_3a0,1);
      }
      uVar3 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 < local_380._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_360,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tLocation:        ",0x12);
  WorldCoordinates::GetAsString_abi_cxx11_((KString *)local_340,&this->m_Loc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tOrientation:     ",0x12);
  EulerAngles::GetAsString_abi_cxx11_(&local_3a0,&this->m_Ori);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_3a0._M_dataplus._M_p._1_7_,
                                              (char)local_3a0._M_dataplus._M_p),
                      local_3a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tLength:          ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tWidth:           ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tHeight:          ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tDepth:           ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_3a0._M_dataplus._M_p._1_7_,(char)local_3a0._M_dataplus._M_p) !=
      &local_3a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_3a0._M_dataplus._M_p._1_7_,(char)local_3a0._M_dataplus._M_p),
                    local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString LinearSegmentParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LinearSegmentParameter:\n"
       << "\tSegment Number:  " << ( KUINT16 )m_ui8SegNum                     << "\n"
       << "\tModification:\n"
       << "\t\tLocation:      " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\t\tOrientation:   " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << IndentString( m_ObjApr.GetAsString(), 1 )
       << "\tLocation:        " << m_Loc.GetAsString()
       << "\tOrientation:     " << m_Ori.GetAsString()
       << "\tLength:          " << m_ui16Length                                 << "\n"
       << "\tWidth:           " << m_ui16Width                                  << "\n"
       << "\tHeight:          " << m_ui16Height                                 << "\n"
       << "\tDepth:           " << m_ui16Depth                                  << "\n";

    return ss.str();
}